

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.h
# Opt level: O1

base_uint<256U> * __thiscall base_uint<256U>::operator++(base_uint<256U> *this)

{
  uint32_t *puVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  do {
    puVar1 = this->pn + lVar3;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 != 0) break;
    bVar4 = lVar3 != 7;
    lVar3 = lVar3 + 1;
  } while (bVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint& operator++()
    {
        // prefix operator
        int i = 0;
        while (i < WIDTH && ++pn[i] == 0)
            i++;
        return *this;
    }